

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

int Abc_TtCheckWithCubeNeg2Pos(word *t,word *c,int nWords,int iVar)

{
  int iVar1;
  word *tLimit;
  int Step;
  int i_1;
  int Shift;
  int i;
  int iVar_local;
  int nWords_local;
  word *c_local;
  word *t_local;
  
  if (iVar < 6) {
    for (i_1 = 0; i_1 < nWords; i_1 = i_1 + 1) {
      if ((t[i_1] & c[i_1] << ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f)) != 0) {
        return 0;
      }
    }
  }
  else {
    iVar1 = 1 << ((byte)iVar - 6 & 0x1f);
    for (c_local = t; c_local < t + nWords; c_local = c_local + (iVar1 << 1)) {
      for (tLimit._4_4_ = 0; tLimit._4_4_ < iVar1; tLimit._4_4_ = tLimit._4_4_ + 1) {
        if ((c_local[tLimit._4_4_] & c[iVar1 + tLimit._4_4_]) != 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static inline int Abc_TtCheckWithCubeNeg2Pos( word * t, word * c, int nWords, int iVar )
{
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            if ( t[i] & (c[i] << Shift) )
                return 0;
        return 1;
    }
    else
    {
        int i, Step = (1 << (iVar - 6));
        word * tLimit = t + nWords;
        for ( ; t < tLimit; t += 2*Step )
            for ( i = 0; i < Step; i++ )
                if ( t[i] & c[Step+i] )
                    return 0;
        return 1;
    }
}